

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcpuid_util.c
# Opt level: O3

void debug_print_lbits(int debuglevel,uint64_t mask)

{
  ulong uVar1;
  
  uVar1 = 0;
  do {
    if ((mask >> (uVar1 & 0x3f) & 1) != 0) {
      debugf(debuglevel," + ");
      debugf(debuglevel,"LBIT(%d)",uVar1 & 0xffffffff);
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x40);
  debugf(debuglevel,"\n");
  return;
}

Assistant:

void debug_print_lbits(int debuglevel, uint64_t mask)
{
	int i, first = 0;
	for (i = 0; i < 64; i++) if (mask & (((uint64_t) 1) << i)) {
		if (first) first = 0;
		else debugf(debuglevel, " + ");
		debugf(debuglevel, "LBIT(%d)", i);
	}
	debugf(debuglevel, "\n");
}